

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Filter::add_filter(Filter *this,Severity severity)

{
  mapped_type *pmVar1;
  mapped_type in_SIL;
  char *in_stack_ffffffffffffffb8;
  Tag *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffc8;
  map<AixLog::Tag,_AixLog::Severity,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
  *in_stack_ffffffffffffffd0;
  
  Tag::Tag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pmVar1 = std::
           map<AixLog::Tag,_AixLog::Severity,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
           ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *pmVar1 = in_SIL;
  Tag::~Tag((Tag *)0x1cb2f3);
  return;
}

Assistant:

void add_filter(Severity severity) { tag_filter_["*"] = severity; }